

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall pugi::impl::anon_unknown_0::xpath_allocator::release(xpath_allocator *this)

{
  xpath_memory_block *next;
  xpath_memory_block *pxVar1;
  
  pxVar1 = this->_root;
  if (pxVar1 == (xpath_memory_block *)0x0) {
    __assert_fail("cur",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                  ,0x1e2e,"void pugi::impl::(anonymous namespace)::xpath_allocator::release()");
  }
  while (pxVar1 = pxVar1->next, pxVar1 != (xpath_memory_block *)0x0) {
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
  }
  return;
}

Assistant:

void release()
		{
			xpath_memory_block* cur = _root;
			assert(cur);

			while (cur->next)
			{
				xpath_memory_block* next = cur->next;

				xml_memory::deallocate(cur);

				cur = next;
			}
		}